

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::eval_error::eval_error
          (eval_error *this,string *t_why,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  string local_58;
  Dispatch_Engine *local_38;
  Dispatch_Engine *t_ss_local;
  eval_error *peStack_28;
  bool t_dot_notation_local;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *t_functions_local;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters_local;
  string *t_why_local;
  eval_error *this_local;
  
  local_38 = t_ss;
  t_ss_local._7_1_ = t_dot_notation;
  peStack_28 = (eval_error *)t_functions;
  t_functions_local =
       (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
        *)t_parameters;
  t_parameters_local =
       (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)t_why;
  t_why_local = (string *)this;
  format(&local_58,t_why,t_parameters,t_dot_notation,t_ss);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)this = &PTR__eval_error_00d56980;
  std::__cxx11::string::string
            ((string *)&this->reason,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_parameters_local
            );
  File_Position::File_Position(&this->start_position);
  std::__cxx11::string::string((string *)&this->filename);
  format_detail_abi_cxx11_
            (&this->detail,peStack_28,
             (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)(ulong)(t_ss_local._7_1_ & 1),SUB81(local_38,0),t_ss);
  Catch::clara::std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
  ::vector(&this->call_stack);
  return;
}

Assistant:

eval_error(const std::string &t_why,
                 const std::vector<Boxed_Value> &t_parameters,
                 const std::vector<chaiscript::Const_Proxy_Function> &t_functions,
                 bool t_dot_notation,
                 const chaiscript::detail::Dispatch_Engine &t_ss) noexcept
          : std::runtime_error(format(t_why, t_parameters, t_dot_notation, t_ss))
          , reason(t_why)
          , detail(format_detail(t_functions, t_dot_notation, t_ss)) {
      }